

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O2

void png_read_filter_row_sub3_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  undefined4 uVar1;
  undefined3 uVar2;
  ulong uVar3;
  png_byte pVar4;
  png_byte pVar5;
  png_byte pVar6;
  
  pVar4 = '\0';
  pVar5 = '\0';
  pVar6 = '\0';
  for (uVar3 = row_info->rowbytes; 3 < uVar3; uVar3 = uVar3 - 3) {
    uVar1 = *(undefined4 *)row;
    pVar4 = pVar4 + (char)uVar1;
    pVar5 = pVar5 + (char)((uint)uVar1 >> 8);
    pVar6 = pVar6 + (char)((uint)uVar1 >> 0x10);
    *row = pVar4;
    row[1] = pVar5;
    row[2] = pVar6;
    row = row + 3;
  }
  if (uVar3 != 0) {
    uVar2 = *(undefined3 *)row;
    *(ushort *)row = CONCAT11(pVar5 + (char)((uint3)uVar2 >> 8),pVar4 + (char)uVar2);
    row[2] = pVar6 + (char)((uint3)uVar2 >> 0x10);
  }
  return;
}

Assistant:

void png_read_filter_row_sub3_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* The Sub filter predicts each pixel as the previous pixel, a.
    * There is no pixel to the left of the first pixel.  It's encoded directly.
    * That works with our main loop if we just say that left pixel was zero.
    */
   size_t rb;

   __m128i a, d = _mm_setzero_si128();

   png_debug(1, "in png_read_filter_row_sub3_sse2");

   rb = row_info->rowbytes;
   while (rb >= 4) {
      a = d; d = load4(row);
      d = _mm_add_epi8(d, a);
      store3(row, d);

      row += 3;
      rb  -= 3;
   }
   if (rb > 0) {
      a = d; d = load3(row);
      d = _mm_add_epi8(d, a);
      store3(row, d);

      row += 3;
      rb  -= 3;
   }
   PNG_UNUSED(prev)
}